

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O2

LPBYTE __thiscall TRootHandler_MNDX::GetKey(TRootHandler_MNDX *this,char *szFileName,PDWORD param_2)

{
  char *pcVar1;
  int iVar2;
  PMNDX_PACKAGE p_Var3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  char *szFileName_00;
  PMNDX_ROOT_ENTRY pRootEntry;
  char szNormName [1025];
  undefined8 local_420;
  char local_418 [1032];
  
  local_420 = (PMNDX_ROOT_ENTRY)0x0;
  NormalizeFileName_LowerSlash(local_418,szFileName,0x400);
  p_Var3 = FindMndxPackage(this,local_418);
  if (p_Var3 == (PMNDX_PACKAGE)0x0) {
    pBVar4 = (BYTE *)0x0;
  }
  else {
    szFileName_00 = local_418 + (p_Var3->nLength - 1);
    do {
      pcVar1 = szFileName_00 + 1;
      szFileName_00 = szFileName_00 + 1;
    } while (*pcVar1 == '/');
    iVar2 = SearchMndxInfo(this,szFileName_00,p_Var3->nIndex,(PMNDX_ROOT_ENTRY *)&local_420);
    pBVar5 = local_420->CKey;
    if (local_420 == (PMNDX_ROOT_ENTRY)0x0) {
      pBVar5 = (BYTE *)0x0;
    }
    pBVar4 = (BYTE *)0x0;
    if (iVar2 == 0) {
      pBVar4 = pBVar5;
    }
  }
  return pBVar4;
}

Assistant:

LPBYTE GetKey(const char * szFileName, PDWORD /* PtrFileSize */)
    {
        PMNDX_ROOT_ENTRY pRootEntry = NULL;
        PMNDX_PACKAGE pPackage;
        char * szStrippedName;
        char szNormName[MAX_PATH+1];
        int nError;

        // Convert the file name to lowercase + slashes
        NormalizeFileName_LowerSlash(szNormName, szFileName, MAX_PATH);

        // Find the package number
        pPackage = FindMndxPackage(szNormName);
        if(pPackage == NULL)
            return NULL;

        // Cut the package name off the full path
        szStrippedName = szNormName + pPackage->nLength;
        while(szStrippedName[0] == '/')
            szStrippedName++;

        // Find the root entry
        nError = SearchMndxInfo(szStrippedName, (DWORD)(pPackage->nIndex), &pRootEntry);
        if(nError != ERROR_SUCCESS || pRootEntry == NULL)
            return NULL;

        // Return the CKey
        return pRootEntry->CKey;
    }